

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DLM.cpp
# Opt level: O1

void __thiscall OpenMD::DLM::doRotate(DLM *this,StuntDouble *sd,Vector3d *ji,RealType dt)

{
  int axes2;
  DLM *this_00;
  uint axes2_00;
  uint axes1;
  RealType angle;
  double dVar2;
  Mat3x3d I;
  RotMat3x3d A;
  DLM local_c0 [4];
  double local_a0;
  double local_80;
  RotMat3x3d local_78;
  ulong uVar1;
  
  dVar2 = dt * 0.5;
  StuntDouble::getA(&local_78,sd);
  this_00 = local_c0;
  (*sd->_vptr_StuntDouble[5])(this_00,sd);
  if (sd->linear_ == true) {
    axes2 = sd->linearAxis_;
    axes2_00 = axes2 + ((axes2 + 1) / 3) * -3 + 1;
    uVar1 = (ulong)axes2_00;
    axes1 = axes2 + ((axes2 + 2) / 3) * -3 + 2;
    rotateStep(this_00,axes1,axes2,
               ((ji->super_Vector<double,_3U>).data_[uVar1] * dVar2) /
               (double)local_c0[uVar1 * 4].super_RotationAlgorithm._vptr_RotationAlgorithm,ji,
               &local_78);
    rotateStep(this_00,axes2,axes2_00,
               (dt * (ji->super_Vector<double,_3U>).data_[axes1]) /
               (double)local_c0[(ulong)axes1 * 4].super_RotationAlgorithm._vptr_RotationAlgorithm,ji
               ,&local_78);
    angle = (dVar2 * (ji->super_Vector<double,_3U>).data_[uVar1]) /
            (double)local_c0[uVar1 * 4].super_RotationAlgorithm._vptr_RotationAlgorithm;
  }
  else {
    rotateStep(this_00,1,2,
               ((ji->super_Vector<double,_3U>).data_[0] * dVar2) /
               (double)local_c0[0].super_RotationAlgorithm._vptr_RotationAlgorithm,ji,&local_78);
    rotateStep(this_00,2,0,((ji->super_Vector<double,_3U>).data_[1] * dVar2) / local_a0,ji,&local_78
              );
    rotateStep(this_00,0,1,(dt * (ji->super_Vector<double,_3U>).data_[2]) / local_80,ji,&local_78);
    rotateStep(this_00,2,0,((ji->super_Vector<double,_3U>).data_[1] * dVar2) / local_a0,ji,&local_78
              );
    angle = (dVar2 * (ji->super_Vector<double,_3U>).data_[0]) /
            (double)local_c0[0].super_RotationAlgorithm._vptr_RotationAlgorithm;
    axes1 = 1;
    axes2 = 2;
  }
  rotateStep(this_00,axes1,axes2,angle,ji,&local_78);
  (*sd->_vptr_StuntDouble[3])(sd,&local_78);
  return;
}

Assistant:

void DLM::doRotate(StuntDouble* sd, Vector3d& ji, RealType dt) {
    RealType dt2 = 0.5 * dt;
    RealType angle;

    RotMat3x3d A = sd->getA();
    Mat3x3d I    = sd->getI();

    // use the angular velocities to propagate the rotation matrix a full time
    // step
    if (sd->isLinear()) {
      int i = sd->linearAxis();
      int j = (i + 1) % 3;
      int k = (i + 2) % 3;

      angle = dt2 * ji[j] / I(j, j);
      rotateStep(k, i, angle, ji, A);

      angle = dt * ji[k] / I(k, k);
      rotateStep(i, j, angle, ji, A);

      angle = dt2 * ji[j] / I(j, j);
      rotateStep(k, i, angle, ji, A);

    } else {
      // rotate about the x-axis
      angle = dt2 * ji[0] / I(0, 0);
      rotateStep(1, 2, angle, ji, A);

      // rotate about the y-axis
      angle = dt2 * ji[1] / I(1, 1);
      rotateStep(2, 0, angle, ji, A);

      // rotate about the z-axis
      angle = dt * ji[2] / I(2, 2);
      rotateStep(0, 1, angle, ji, A);

      // rotate about the y-axis
      angle = dt2 * ji[1] / I(1, 1);
      rotateStep(2, 0, angle, ji, A);

      // rotate about the x-axis
      angle = dt2 * ji[0] / I(0, 0);
      rotateStep(1, 2, angle, ji, A);
    }

    sd->setA(A);
  }